

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_srst(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  int iVar1;
  uintptr_t o_2;
  TCGv_i32 pTVar2;
  TCGv_i32 pTVar3;
  uintptr_t o_1;
  TCGTemp *local_38;
  TCGTemp *local_30;
  TCGTemp *local_28;
  
  tcg_ctx = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_r1,FLD_C_b1);
  pTVar2 = tcg_const_i32_s390x(tcg_ctx,iVar1);
  iVar1 = get_field1(s,FLD_O_r2,FLD_C_b2);
  pTVar3 = tcg_const_i32_s390x(tcg_ctx,iVar1);
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_30 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
  local_28 = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
  tcg_gen_callN_s390x(tcg_ctx,helper_srst,(TCGTemp *)0x0,3,&local_38);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_srst(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 r1 = tcg_const_i32(tcg_ctx, get_field(s, r1));
    TCGv_i32 r2 = tcg_const_i32(tcg_ctx, get_field(s, r2));

    gen_helper_srst(tcg_ctx, tcg_ctx->cpu_env, r1, r2);

    tcg_temp_free_i32(tcg_ctx, r1);
    tcg_temp_free_i32(tcg_ctx, r2);
    set_cc_static(s);
    return DISAS_NEXT;
}